

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O3

void __thiscall CVmMT19937::seed(CVmMT19937 *this,uint32_t s)

{
  int iVar1;
  int iVar2;
  
  this->mt[0] = s;
  this->idx = 1;
  iVar2 = 1;
  do {
    this->mt[iVar2] =
         (this->mt[(long)iVar2 + -1] >> 0x1e ^ this->mt[(long)iVar2 + -1]) * 0x6c078965 + iVar2;
    iVar1 = this->idx;
    iVar2 = iVar1 + 1;
    this->idx = iVar2;
  } while (iVar1 < 0x26f);
  iVar2 = 0x25;
  do {
    rand(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void seed(uint32_t s)
    {
        /* do a pass through the mt array with LCG values from the seed */
        base_seed(s);

        /* 
         *   discard a few initial values to prime the pump - the MT
         *   algorithm is considered slow at getting started (i.e., it needs
         *   to run through a few iterations before it starts generating good
         *   numbers)
         */
        for (int i = 0 ; i < 37 ; ++i)
            rand();
    }